

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O2

void Aig_ObjAddFanout(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pFanout)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  uint *puVar6;
  int iVar7;
  uint *puVar8;
  long lVar9;
  char *__assertion;
  ulong uVar10;
  
  if (p->pFanData == (int *)0x0) {
    __assertion = "p->pFanData";
    uVar1 = 0x6e;
  }
  else if ((((uint)pFanout | (uint)pObj) & 1) == 0) {
    iVar7 = pFanout->Id;
    if (iVar7 < 1) {
      __assertion = "pFanout->Id > 0";
      uVar1 = 0x70;
    }
    else {
      iVar3 = pObj->Id;
      uVar1 = p->nFansAlloc;
      uVar10 = (ulong)uVar1;
      if ((int)uVar1 <= iVar3 || (int)uVar1 <= iVar7) {
        if (iVar7 < iVar3) {
          iVar7 = iVar3;
        }
        uVar10 = (long)iVar7 * 2;
        piVar5 = (int *)realloc(p->pFanData,(ulong)(uint)(iVar7 * 10) << 2);
        p->pFanData = piVar5;
        memset(piVar5 + (long)p->nFansAlloc * 5,0,(uVar10 - (long)p->nFansAlloc) * 0x14);
        p->nFansAlloc = (int)uVar10;
        iVar3 = pObj->Id;
      }
      if ((iVar3 < (int)uVar10) && (iVar7 = pFanout->Id, iVar7 < (int)uVar10)) {
        uVar4 = Aig_ObjWhatFanin(pFanout,pObj);
        uVar1 = uVar4 + iVar7 * 2;
        piVar5 = p->pFanData;
        iVar7 = iVar7 * 2 >> 1;
        puVar8 = (uint *)(piVar5 + (long)(iVar7 * 5) + (ulong)uVar4 + 1);
        puVar6 = (uint *)(piVar5 + (long)(iVar7 * 5) + (ulong)uVar4 + 3);
        lVar9 = (long)pObj->Id;
        uVar4 = piVar5[lVar9 * 5];
        if (uVar4 == 0) {
          piVar5[lVar9 * 5] = uVar1;
        }
        else {
          uVar2 = piVar5[(long)(((int)uVar4 >> 1) * 5) + (ulong)(uVar4 & 1) + 1];
          if (piVar5[(long)(((int)uVar2 >> 1) * 5) + (ulong)(uVar2 & 1) + 3] != uVar4) {
            __assert_fail("*pNext == *pFirst",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                          ,0x87,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          *puVar8 = uVar2;
          puVar8 = (uint *)(piVar5 + (long)(((int)uVar4 >> 1) * 5) + (ulong)(uVar4 & 1) + 1);
          *puVar6 = piVar5[lVar9 * 5];
          puVar6 = (uint *)(piVar5 + (long)(((int)uVar2 >> 1) * 5) + (ulong)(uVar2 & 1) + 3);
        }
        *puVar8 = uVar1;
        *puVar6 = uVar1;
        return;
      }
      __assertion = "pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc";
      uVar1 = 0x78;
    }
  }
  else {
    __assertion = "!Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout)";
    uVar1 = 0x6f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigFanout.c"
                ,uVar1,"void Aig_ObjAddFanout(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjAddFanout( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData );
    assert( !Aig_IsComplement(pObj) && !Aig_IsComplement(pFanout) );
    assert( pFanout->Id > 0 );
    if ( pObj->Id >= p->nFansAlloc || pFanout->Id >= p->nFansAlloc )
    {
        int nFansAlloc = 2 * Abc_MaxInt( pObj->Id, pFanout->Id ); 
        p->pFanData = ABC_REALLOC( int, p->pFanData, 5 * nFansAlloc );
        memset( p->pFanData + 5 * p->nFansAlloc, 0, sizeof(int) * 5 * (nFansAlloc - p->nFansAlloc) );
        p->nFansAlloc = nFansAlloc;
    }
    assert( pObj->Id < p->nFansAlloc && pFanout->Id < p->nFansAlloc );
    iFan   = Aig_FanoutCreate( pFanout->Id, Aig_ObjWhatFanin(pFanout, pObj) );
    pPrevC = Aig_FanoutPrev( p->pFanData, iFan );
    pNextC = Aig_FanoutNext( p->pFanData, iFan );
    pFirst = Aig_FanoutObj( p->pFanData, pObj->Id );
    if ( *pFirst == 0 )
    {
        *pFirst = iFan;
        *pPrevC = iFan;
        *pNextC = iFan;
    }
    else
    {
        pPrev = Aig_FanoutPrev( p->pFanData, *pFirst );
        pNext = Aig_FanoutNext( p->pFanData, *pPrev );
        assert( *pNext == *pFirst );
        *pPrevC = *pPrev;
        *pNextC = *pFirst;
        *pPrev  = iFan;
        *pNext  = iFan;
    }
}